

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::GetTransitiveDependencies
          (CommandLineInterface *this,FileDescriptor *file,
          flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *already_seen,RepeatedPtrField<google::protobuf::FileDescriptorProto> *output,
          TransitiveDependencyOptions *options)

{
  int iVar1;
  FileDescriptor *file_00;
  pointer proto;
  DescriptorPool *pool;
  FileDescriptorProto *new_descriptor;
  undefined1 local_48 [4];
  int i;
  bool local_38;
  TransitiveDependencyOptions *local_30;
  TransitiveDependencyOptions *options_local;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *output_local;
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *already_seen_local;
  FileDescriptor *file_local;
  CommandLineInterface *this_local;
  
  local_30 = options;
  options_local = (TransitiveDependencyOptions *)output;
  output_local = (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)already_seen;
  already_seen_local =
       (flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        *)file;
  file_local = (FileDescriptor *)this;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::insert<const_google::protobuf::FileDescriptor_*,_0>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>::iterator,_bool>
              *)local_48,
             &already_seen->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ,(FileDescriptor **)&already_seen_local);
  if (((local_38 ^ 0xffU) & 1) == 0) {
    for (new_descriptor._4_4_ = 0;
        iVar1 = FileDescriptor::dependency_count((FileDescriptor *)already_seen_local),
        new_descriptor._4_4_ < iVar1; new_descriptor._4_4_ = new_descriptor._4_4_ + 1) {
      file_00 = FileDescriptor::dependency
                          ((FileDescriptor *)already_seen_local,new_descriptor._4_4_);
      GetTransitiveDependencies
                (this,file_00,
                 (flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)output_local,
                 (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)options_local,local_30);
    }
    proto = RepeatedPtrField<google::protobuf::FileDescriptorProto>::Add
                      ((RepeatedPtrField<google::protobuf::FileDescriptorProto> *)options_local);
    FileDescriptor::CopyTo((FileDescriptor *)already_seen_local,proto);
    if ((local_30->include_source_code_info & 1U) != 0) {
      FileDescriptor::CopySourceCodeInfoTo((FileDescriptor *)already_seen_local,proto);
    }
    if ((local_30->retain_options & 1U) == 0) {
      pool = FileDescriptor::pool((FileDescriptor *)already_seen_local);
      StripSourceRetentionOptions(pool,proto);
    }
    if ((local_30->include_json_name & 1U) != 0) {
      FileDescriptor::CopyJsonNameTo((FileDescriptor *)already_seen_local,proto);
    }
  }
  return;
}

Assistant:

void CommandLineInterface::GetTransitiveDependencies(
    const FileDescriptor* file,
    absl::flat_hash_set<const FileDescriptor*>* already_seen,
    RepeatedPtrField<FileDescriptorProto>* output,
    const TransitiveDependencyOptions& options) {
  if (!already_seen->insert(file).second) {
    // Already saw this file.  Skip.
    return;
  }

  // Add all dependencies.
  for (int i = 0; i < file->dependency_count(); ++i) {
    GetTransitiveDependencies(file->dependency(i), already_seen, output,
                              options);
  }

  // Add this file.
  FileDescriptorProto* new_descriptor = output->Add();
  file->CopyTo(new_descriptor);
  if (options.include_source_code_info) {
    file->CopySourceCodeInfoTo(new_descriptor);
  }
  if (!options.retain_options) {
    StripSourceRetentionOptions(*file->pool(), *new_descriptor);
  }
  if (options.include_json_name) {
    file->CopyJsonNameTo(new_descriptor);
  }
}